

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O0

bool __thiscall
gl3cts::TransformFeedbackOverflowQueryContextStateBase::verifyCurrentQueryState
          (TransformFeedbackOverflowQueryContextStateBase *this,GLenum target,GLuint index,
          GLuint value)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  GLuint local_38;
  GLuint local_34;
  GLint actual;
  GLint expected;
  Functions *gl;
  GLuint local_20;
  GLuint value_local;
  GLuint index_local;
  GLenum target_local;
  TransformFeedbackOverflowQueryContextStateBase *this_local;
  
  gl._4_4_ = value;
  local_20 = index;
  value_local = target;
  _index_local = this;
  pRVar2 = deqp::Context::getRenderContext
                     ((this->super_TransformFeedbackOverflowQueryBaseTest).super_TestCase.m_context)
  ;
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  _actual = CONCAT44(extraout_var,iVar1);
  local_34 = gl._4_4_;
  (**(code **)(_actual + 0xa00))(value_local,local_20,0x8865,&local_38);
  if (local_38 == local_34) {
    if ((local_20 == 0) &&
       ((**(code **)(_actual + 0xa28))(value_local,0x8865,&local_38), local_38 != local_34)) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool verifyCurrentQueryState(GLenum target, GLuint index, GLuint value)
	{
		const glw::Functions& gl	   = m_context.getRenderContext().getFunctions();
		GLint				  expected = (GLint)value;
		GLint				  actual;

		// Use GetQueryIndexediv by default
		gl.getQueryIndexediv(target, index, GL_CURRENT_QUERY, &actual);
		if (actual != expected)
		{
			return false;
		}

		if (index == 0)
		{
			// If index is zero then GetQueryiv should also return the expected value
			gl.getQueryiv(target, GL_CURRENT_QUERY, &actual);
			if (actual != expected)
			{
				return false;
			}
		}

		return true;
	}